

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

void Abs_RpmPerformMark(Gia_Man_t *p,int nCutMax,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint nSize0;
  uint uVar6;
  long lVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *vAnds;
  Vec_Int_t *vSupp;
  Vec_Int_t *__ptr;
  long lVar10;
  word *pTruth;
  ulong uVar11;
  char *pcVar12;
  uint local_78;
  
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark1(p);
  pVVar8 = p->vCis;
  uVar11 = (ulong)(uint)pVVar8->nSize;
  if (p->nRegs < pVVar8->nSize) {
    lVar7 = 0;
    do {
      if ((int)uVar11 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar8->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00577f6a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      *(ulong *)pGVar1 = *(ulong *)pGVar1 | 0x4000000000000000;
      lVar7 = lVar7 + 1;
      pVVar8 = p->vCis;
      uVar11 = (ulong)pVVar8->nSize;
    } while (lVar7 < (long)(uVar11 - (long)p->nRegs));
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  vAnds = (Vec_Int_t *)malloc(0x10);
  vAnds->nCap = 100;
  vAnds->nSize = 0;
  piVar9 = (int *)malloc(400);
  vAnds->pArray = piVar9;
  vSupp = (Vec_Int_t *)malloc(0x10);
  vSupp->nCap = 100;
  vSupp->nSize = 0;
  piVar9 = (int *)malloc(400);
  vSupp->pArray = piVar9;
  local_78 = 0;
  do {
    Gia_ManComputeDoms(p);
    __ptr = Gia_ManCollectDoms(p);
    if (fVerbose != 0 || fVeryVerbose != 0) {
      Gia_ManCountPisNodes(p,pVVar8,vAnds);
      printf("Iter %3d :  ",(ulong)local_78);
      printf("PI = %5d  (%6.2f %%)  ",
             ((double)pVVar8->nSize * 100.0) / (double)(p->vCis->nSize - p->nRegs));
      printf("And = %6d  (%6.2f %%) ",
             ((double)vAnds->nSize * 100.0) /
             (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
      printf("Dom = %5d  (%6.2f %%)  ",
             ((double)__ptr->nSize * 100.0) /
             (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
      putchar(10);
    }
    iVar2 = __ptr->nSize;
    if ((long)iVar2 < 1) {
      bVar3 = true;
    }
    else {
      piVar9 = __ptr->pArray;
      lVar7 = 0;
      bVar3 = false;
      do {
        lVar10 = (long)piVar9[lVar7];
        if ((lVar10 < 0) || (p->nObjs <= piVar9[lVar7])) goto LAB_00577f6a;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar1 = p->pObjs + lVar10;
        if (((undefined1  [12])*pGVar1 & (undefined1  [12])0x4000000000000000) !=
            (undefined1  [12])0x0) {
          __assert_fail("!pObj->fMark1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x2c9,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
        }
        if (p->pRefs[lVar10] < 1) {
          __assert_fail("Gia_ObjRefNum( p, pObj ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                        ,0x2ca,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
        }
        uVar4 = Abs_GiaObjDeref_rec(p,pGVar1);
        iVar5 = Abs_ManSupport2(p,pGVar1,vSupp);
        if (nCutMax < iVar5) {
          Abs_GiaObjRef_rec(p,pGVar1);
        }
        else {
          nSize0 = Abs_GiaSortNodes(p,vSupp);
          if (((int)nSize0 < 1) || (nCutMax < (int)nSize0)) {
            __assert_fail("nSize0 > 0 && nSize0 <= nCutMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRpm.c"
                          ,0x2eb,"void Abs_RpmPerformMark(Gia_Man_t *, int, int, int)");
          }
          pTruth = Gia_ObjComputeTruthTableCut(p,pGVar1,vSupp);
          if (pTruth != (word *)0x0) {
            uVar6 = Abs_GiaCheckTruth(pTruth,vSupp->nSize,nSize0);
            if (fVeryVerbose != 0) {
              printf("Nodes =%3d ",(ulong)uVar4);
              printf("Size =%3d ",(ulong)(uint)vSupp->nSize);
              printf("Size0 =%3d  ",(ulong)nSize0);
              pcVar12 = "no";
              if (uVar6 == 0) {
                pcVar12 = "yes";
              }
              printf("%3s",pcVar12);
              Abs_GiaCofPrint(pTruth,vSupp->nSize,nSize0,uVar6 ^ 1);
            }
            if (uVar6 != 0) {
              *(ulong *)pGVar1 = *(ulong *)pGVar1 | 0x4000000000000000;
              bVar3 = true;
              goto LAB_00577dd0;
            }
          }
          Abs_GiaObjRef_rec(p,pGVar1);
        }
LAB_00577dd0:
        lVar7 = lVar7 + 1;
      } while (iVar2 != lVar7);
      bVar3 = !bVar3;
    }
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      free(__ptr);
    }
    local_78 = local_78 + 1;
    if (bVar3) {
      if (fVeryVerbose != 0) {
        Gia_ManCountPisNodes(p,pVVar8,vAnds);
        printf("Iter %3d :  ",(ulong)local_78);
        printf("PI = %5d  (%6.2f %%)  ",
               ((double)pVVar8->nSize * 100.0) / (double)(p->vCis->nSize - p->nRegs));
        printf("And = %6d  (%6.2f %%) ",
               ((double)vAnds->nSize * 100.0) /
               (double)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
        putchar(10);
      }
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
        pVVar8->pArray = (int *)0x0;
      }
      free(pVVar8);
      if (vAnds->pArray != (int *)0x0) {
        free(vAnds->pArray);
        vAnds->pArray = (int *)0x0;
      }
      free(vAnds);
      if (vSupp->pArray != (int *)0x0) {
        free(vSupp->pArray);
        vSupp->pArray = (int *)0x0;
      }
      free(vSupp);
      if (p->pRefs != (int *)0x0) {
        free(p->pRefs);
        p->pRefs = (int *)0x0;
      }
      return;
    }
  } while( true );
}

Assistant:

void Abs_RpmPerformMark( Gia_Man_t * p, int nCutMax, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vPis, * vAnds, * vDoms;
    Vec_Int_t * vSupp, * vSupp1, * vSupp2;
    Gia_Obj_t * pObj;
    word * pTruth;
    int Iter, i, nSize0, nNodes;
    int fHasConst, fChanges = 1;
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    vPis = Vec_IntAlloc( 100 );
    vAnds = Vec_IntAlloc( 100 );
    vSupp1 = Vec_IntAlloc( 100 );
    vSupp2 = Vec_IntAlloc( 100 );
    for ( Iter = 0; fChanges; Iter++ )
    {
        fChanges = 0;
        vDoms = Gia_ManComputePiDoms( p );
        // count the number of PIs and internal nodes
        if ( fVerbose || fVeryVerbose )
        {
            Gia_ManCountPisNodes( p, vPis, vAnds );
            printf( "Iter %3d :  ", Iter );
            printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
            printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
            printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
            printf( "\n" );
        }
//        pObj = Gia_ObjFanin0( Gia_ManPo(p, 1) );
        Gia_ManForEachObjVec( vDoms, p, pObj, i )
        {
            assert( !pObj->fMark1 );
            assert( Gia_ObjRefNum( p, pObj ) > 0 );
            // dereference root node
            nNodes = Abs_GiaObjDeref_rec( p, pObj );
/*
            // compute support of full cone
            if ( Abs_ManSupport1(p, pObj, vSupp1) > nCutMax )
//            if ( 1 )
            {
                // check support of MFFC
                if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
//                if ( 1 )
                {
                    Abs_GiaObjRef_rec( p, pObj );
                    continue;
                }
                vSupp = vSupp2;
//                printf( "-" );
            }
            else
            {
                vSupp = vSupp1;
//                printf( "+" );
            }
*/
            if ( Abs_ManSupport2(p, pObj, vSupp2) > nCutMax )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            vSupp = vSupp2;

            // order nodes by their ref counts
            nSize0 = Abs_GiaSortNodes( p, vSupp );
            assert( nSize0 > 0 && nSize0 <= nCutMax );
            // check if truth table has const cofs
            pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vSupp );
            if ( pTruth == NULL )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            fHasConst = !Abs_GiaCheckTruth( pTruth, Vec_IntSize(vSupp), nSize0 );
            if ( fVeryVerbose )
            {
                printf( "Nodes =%3d ",  nNodes );
                printf( "Size =%3d ",   Vec_IntSize(vSupp) );
                printf( "Size0 =%3d  ", nSize0 );
                printf( "%3s", fHasConst ? "yes" : "no" );
                Abs_GiaCofPrint( pTruth, Vec_IntSize(vSupp), nSize0, fHasConst );
            }
            if ( fHasConst )
            {
                Abs_GiaObjRef_rec( p, pObj );
                continue;
            }
            // pObj can be reparamed
            pObj->fMark1 = 1;
            fChanges = 1;
        }
        Vec_IntFree( vDoms );
    }
    // count the number of PIs and internal nodes
    if ( fVeryVerbose )
    {
        Gia_ManCountPisNodes( p, vPis, vAnds );
        printf( "Iter %3d :  ", Iter );
        printf( "PI = %5d  (%6.2f %%)  ",  Vec_IntSize(vPis),  100.0 * Vec_IntSize(vPis)  / Gia_ManPiNum(p)  );
        printf( "And = %6d  (%6.2f %%) ",  Vec_IntSize(vAnds), 100.0 * Vec_IntSize(vAnds) / Gia_ManAndNum(p) );
//        printf( "Dom = %5d  (%6.2f %%)  ", Vec_IntSize(vDoms), 100.0 * Vec_IntSize(vDoms) / Gia_ManAndNum(p)  );
        printf( "\n" );
    }
    // cleanup
    Vec_IntFree( vPis );
    Vec_IntFree( vAnds );
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
//    Gia_ManCleanMark1( p ); // this will erase markings
    ABC_FREE( p->pRefs );
}